

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O3

int __thiscall Cmd::completeLine(Cmd *this,State *state)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  size_type sVar3;
  _Base_ptr p_Var4;
  ssize_t sVar5;
  size_type sVar6;
  pointer pcVar7;
  ulong uVar8;
  int iVar9;
  char cVar10;
  ulong uVar11;
  char ch;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  completions;
  State saved;
  char local_99;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  long *local_80 [2];
  long local_70 [2];
  size_t local_60;
  size_t sStack_58;
  size_t sStack_50;
  undefined1 uStack_48;
  undefined7 local_47;
  undefined1 uStack_40;
  undefined8 uStack_3f;
  
  local_99 = '\0';
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&local_98,(this->commands_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  p_Var4 = (this->commands_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->commands_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      pcVar2 = (state->buf)._M_dataplus._M_p;
      sVar3 = (state->buf)._M_string_length;
      pcVar7 = pcVar2;
      if (sVar3 == 0) {
LAB_00104348:
        if (pcVar7 == pcVar2 + sVar3) goto LAB_00104350;
      }
      else {
        sVar6 = 0;
        do {
          if (pcVar2[sVar6] != *(char *)(*(long *)(p_Var4 + 1) + sVar6)) {
            pcVar7 = pcVar2 + sVar6;
            goto LAB_00104348;
          }
          sVar6 = sVar6 + 1;
        } while (sVar3 != sVar6);
LAB_00104350:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_98,(value_type *)(p_Var4 + 1));
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  if (local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    fputc(7,_stderr);
    fflush(_stderr);
    cVar10 = local_99;
  }
  else {
    uVar8 = 0;
    while( true ) {
      if (uVar8 < (ulong)((long)local_98.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_98.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        pcVar2 = (state->buf)._M_dataplus._M_p;
        local_80[0] = local_70;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_80,pcVar2,pcVar2 + (state->buf)._M_string_length);
        local_60 = state->pos;
        sStack_58 = state->oldpos;
        sStack_50 = state->cols;
        uStack_3f = *(undefined8 *)((long)&state->history_index + 1);
        uStack_40 = (undefined1)((ulong)*(undefined8 *)((long)&state->maxrows + 1) >> 0x38);
        uStack_48 = (undefined1)state->maxrows;
        local_47 = (undefined7)(state->maxrows >> 8);
        state->pos = local_98.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_string_length;
        std::__cxx11::string::_M_assign((string *)state);
        refreshLine(this,state);
        state->pos = local_60;
        std::__cxx11::string::_M_assign((string *)state);
        if (local_80[0] != local_70) {
          operator_delete(local_80[0],local_70[0] + 1);
        }
      }
      else {
        refreshLine(this,state);
      }
      sVar5 = read(this->in_fd_,&local_99,1);
      cVar10 = local_99;
      if (sVar5 < 1) {
        iVar9 = -1;
        goto LAB_00104530;
      }
      if (local_99 != '\t') break;
      uVar11 = (long)local_98.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_98.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      uVar8 = (uVar8 + 1) % (uVar11 + 1);
      if (uVar8 == uVar11) {
        fputc(7,_stderr);
        fflush(_stderr);
        uVar8 = uVar11;
      }
    }
    if (local_99 == '\x1b') {
      cVar10 = '\x1b';
      if (uVar8 < (ulong)((long)local_98.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_98.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        refreshLine(this,state);
      }
    }
    else if (uVar8 < (ulong)((long)local_98.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_98.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5)) {
      std::__cxx11::string::_M_assign((string *)state);
      state->pos = (state->buf)._M_string_length;
    }
  }
  iVar9 = (int)cVar10;
LAB_00104530:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  return iVar9;
}

Assistant:

int completeLine(State *state) {

		char ch = 0;

		// get a list of commands
		std::vector<std::string> completions;
		completions.reserve(commands_.size());
		for (auto &&elem : commands_) {
			const std::string &name = elem.first;

			if (starts_with(name, state->buf)) {
				completions.push_back(name);
			}
		}

		if (completions.empty()) {
			beep();
		} else {
			bool stop = false;
			size_t i  = 0;

			while (!stop) {
				// Show completion or original buffer
				if (i < completions.size()) {
					State saved = *state;

					state->pos = completions[i].size();
					state->buf = completions[i];

					refreshLine(state);
					state->pos = saved.pos;
					state->buf = saved.buf;
				} else {
					refreshLine(state);
				}

				if (read_char(&ch) <= 0) {
					return -1;
				}

				switch (ch) {
				case TAB: // tab
					i = (i + 1) % (completions.size() + 1);
					if (i == completions.size())
						beep();
					break;
				case ESC: // escape
					// Re-show original buffer
					if (i < completions.size())
						refreshLine(state);
					stop = true;
					break;
				default:
					// Update buffer and return
					if (i < completions.size()) {
						state->buf = completions[i];
						state->pos = state->buf.size();
					}
					stop = true;
					break;
				}
			}
		}

		return ch;
	}